

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

CaseStatementSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CaseStatementSyntax,slang::syntax::NamedLabelSyntax*,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::CaseItemSyntax>&,slang::parsing::Token>
          (BumpAllocator *this,NamedLabelSyntax **args,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1,Token *args_2,Token *args_3,
          Token *args_4,ExpressionSyntax *args_5,Token *args_6,Token *args_7,
          SyntaxList<slang::syntax::CaseItemSyntax> *args_8,Token *args_9)

{
  Token uniqueOrPriority;
  Token endcase;
  CaseStatementSyntax *label;
  Token *in_RCX;
  Token *in_R8;
  SyntaxList<slang::syntax::CaseItemSyntax> *in_R9;
  Token *in_stack_00000010;
  undefined8 *in_stack_00000018;
  undefined8 *in_stack_00000028;
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  BumpAllocator *in_stack_ffffffffffffff08;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_ffffffffffffff40;
  
  label = (CaseStatementSyntax *)
          allocate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  uniqueOrPriority.info = (Info *)*in_stack_00000018;
  uniqueOrPriority._0_8_ = (ExpressionSyntax *)in_stack_00000028[1];
  endcase.info = (Info *)in_RCX;
  endcase._0_8_ = in_R8;
  slang::syntax::CaseStatementSyntax::CaseStatementSyntax
            ((CaseStatementSyntax *)*in_stack_00000028,(NamedLabelSyntax *)label,
             in_stack_ffffffffffffff40,uniqueOrPriority,*in_stack_00000010,
             *(Token *)&in_R9->super_SyntaxListBase,(ExpressionSyntax *)in_stack_00000028[1],*in_R8,
             *in_RCX,in_R9,endcase);
  return label;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }